

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_table.c
# Opt level: O3

int getSubElement(char *element_name,IXML_Node *node,IXML_Node **out)

{
  unsigned_short uVar1;
  int iVar2;
  IXML_Node *nodeptr;
  char *__s1;
  
  nodeptr = ixmlNode_getFirstChild(node);
  *out = (IXML_Node *)0x0;
  do {
    if (nodeptr == (IXML_Node *)0x0) {
      return 0;
    }
    uVar1 = ixmlNode_getNodeType(nodeptr);
    if (uVar1 == 1) {
      __s1 = ixmlNode_getNodeName(nodeptr);
      iVar2 = strcmp(__s1,element_name);
      if (iVar2 == 0) {
        *out = nodeptr;
        return 1;
      }
    }
    nodeptr = ixmlNode_getNextSibling(nodeptr);
  } while( true );
}

Assistant:

int getSubElement(const char *element_name, IXML_Node *node, IXML_Node **out)
{
	const DOMString NodeName = NULL;
	int found = 0;
	IXML_Node *child = (IXML_Node *)ixmlNode_getFirstChild(node);

	(*out) = NULL;
	while (child && !found) {
		switch (ixmlNode_getNodeType(child)) {
		case eELEMENT_NODE:
			NodeName = ixmlNode_getNodeName(child);
			if (!strcmp(NodeName, element_name)) {
				(*out) = child;
				found = 1;
				return found;
			}
			break;
		default:
			break;
		}
		child = (IXML_Node *)ixmlNode_getNextSibling(child);
	}

	return found;
}